

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# px_config.c
# Opt level: O2

int katherine_px_config_load_bpc_data(katherine_px_config_t *px_config,katherine_bpc_t *bpc)

{
  int i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  memset(px_config,0,0x10000);
  for (lVar1 = 0; lVar1 != 0x10000; lVar1 = lVar1 + 1) {
    uVar2 = 0xff - ((uint)((ulong)lVar1 >> 8) & 0xffffff);
    px_config->words[uVar2 >> 2 | uVar3 & 0x3fc0] =
         px_config->words[uVar2 >> 2 | uVar3 & 0x3fc0] |
         ((uint)(byte)(""[bpc->px_config[lVar1] >> 1 & 0xf] * '\x02') | bpc->px_config[lVar1] & 0x21
         ) << (~((char)uVar2 * '\b') & 0x18U);
    uVar3 = uVar3 + 0x40;
  }
  return 0;
}

Assistant:

int
katherine_px_config_load_bpc_data(katherine_px_config_t *px_config, const katherine_bpc_t *bpc)
{
    // Reset the pixel values.
    memset(&px_config->words, 0, 65536);

    int x, y;
    uint32_t *dest = (uint32_t*) px_config->words;
    const unsigned char *src = (const unsigned char *) bpc->px_config;
    static unsigned char reverse_array[] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
    unsigned char val;

    for (int i = 0; i < 65536; ++i) {
        y = i / 256;
        x = i % 256;
        val = (unsigned char) ((src[i] & 0x21) | (reverse_array[((src[i] & 0x1E) >> 1)] << 1));

        y = 255 - y;
        dest[(64 * x) + (y >> 2)] |= (uint32_t) (val << (8 * (3 - (y % 4))));
    }

    return 0;
}